

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
* __thiscall
capnp::Capability::Client::
newCall<capnproto_test::capnp::test::TestPipeline::GetCapParams,capnproto_test::capnp::test::TestPipeline::GetCapResults>
          (Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
           *__return_storage_ptr__,Client *this,uint64_t interfaceId,uint16_t methodId,
          Maybe<capnp::MessageSize> *sizeHint,CallHints hints)

{
  ClientHook *pCVar1;
  Request<capnp::AnyPointer,_capnp::AnyPointer> typeless;
  char local_78 [8];
  uint64_t local_70;
  undefined8 uStack_68;
  BuilderFor<capnproto_test::capnp::test::TestPipeline::GetCapParams> local_60;
  Builder local_38;
  Own<capnp::RequestHook,_std::nullptr_t> local_20;
  
  pCVar1 = (this->hook).ptr;
  local_78[0] = (sizeHint->ptr).isSet;
  if ((bool)local_78[0] == true) {
    local_70 = (sizeHint->ptr).field_1.value.wordCount;
    uStack_68 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  (**pCVar1->_vptr_ClientHook)(&local_38,pCVar1,interfaceId,(ulong)methodId,local_78);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestPipeline::GetCapParams>
            (&local_60,&local_38);
  (__return_storage_ptr__->super_Builder)._builder.dataSize = local_60._builder.dataSize;
  (__return_storage_ptr__->super_Builder)._builder.pointerCount = local_60._builder.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->super_Builder)._builder.field_0x26 =
       local_60._builder._38_2_;
  (__return_storage_ptr__->super_Builder)._builder.data = local_60._builder.data;
  (__return_storage_ptr__->super_Builder)._builder.pointers = local_60._builder.pointers;
  (__return_storage_ptr__->super_Builder)._builder.segment = local_60._builder.segment;
  (__return_storage_ptr__->super_Builder)._builder.capTable = local_60._builder.capTable;
  (__return_storage_ptr__->hook).disposer = local_20.disposer;
  (__return_storage_ptr__->hook).ptr = local_20.ptr;
  local_20.ptr = (RequestHook *)0x0;
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_20);
  return __return_storage_ptr__;
}

Assistant:

inline Request<Params, Results> Capability::Client::newCall(
    uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint, CallHints hints) {
  auto typeless = hook->newCall(interfaceId, methodId, sizeHint, hints);
  return Request<Params, Results>(typeless.template getAs<Params>(), kj::mv(typeless.hook));
}